

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O0

int __thiscall RenX_Ladder_WebPlugin::init(RenX_Ladder_WebPlugin *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  unsigned_long uVar4;
  char *pcVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  size_t local_298;
  char *local_290;
  size_t local_288;
  char *local_280;
  basic_string_view<char,_std::char_traits<char>_> local_278;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  basic_string_view<char,_std::char_traits<char>_> local_1f8;
  allocator<char> local_1e1;
  basic_string_view<char,_std::char_traits<char>_> local_1e0;
  basic_string_view<char,_std::char_traits<char>_> local_1d0;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  allocator<char> local_189;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  allocator<char> local_131;
  basic_string_view<char,_std::char_traits<char>_> local_130;
  basic_string_view<char,_std::char_traits<char>_> local_120;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_d9;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  allocator<char> local_71;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  FILE *pFStack_18;
  int chr;
  FILE *file;
  RenX_Ladder_WebPlugin *this_local;
  undefined7 extraout_var;
  
  file = (FILE *)this;
  local_60 = sv("HeaderFilename",0xe);
  local_70 = sv("RenX.Ladder.Web.Header.html",0x1b);
  local_50 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (&this->field_0x38,local_60._M_len,local_60._M_str,local_70._M_len,
                        local_70._M_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_40,&local_50,&local_71);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->web_header_filename,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_71);
  local_c8 = sv("FooterFilename",0xe);
  local_d8 = sv("RenX.Ladder.Web.Footer.html",0x1b);
  local_b8 = (basic_string_view<char,_std::char_traits<char>_>)
             Jupiter::Config::get
                       (&this->field_0x38,local_c8._M_len,local_c8._M_str,local_d8._M_len,
                        local_d8._M_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_a8,&local_b8,&local_d9);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->web_footer_filename,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_d9);
  local_120 = sv("ProfileFilename",0xf);
  local_130 = sv("RenX.Ladder.Web.Profile.html",0x1c);
  local_110 = (basic_string_view<char,_std::char_traits<char>_>)
              Jupiter::Config::get
                        (&this->field_0x38,local_120._M_len,local_120._M_str,local_130._M_len,
                         local_130._M_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_100,&local_110,&local_131);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->web_profile_filename,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_131);
  local_178 = sv("LadderTableHeaderFilename",0x19);
  local_188 = sv("RenX.Ladder.Web.Ladder.Table.Header.html",0x28);
  local_168 = (basic_string_view<char,_std::char_traits<char>_>)
              Jupiter::Config::get
                        (&this->field_0x38,local_178._M_len,local_178._M_str,local_188._M_len,
                         local_188._M_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_158,&local_168,&local_189);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->web_ladder_table_header_filename,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_189);
  local_1d0 = sv("LadderTableFooterFilename",0x19);
  local_1e0 = sv("RenX.Ladder.Web.Ladder.Table.Footer.html",0x28);
  local_1c0 = (basic_string_view<char,_std::char_traits<char>_>)
              Jupiter::Config::get
                        (&this->field_0x38,local_1d0._M_len,local_1d0._M_str,local_1e0._M_len,
                         local_1e0._M_str);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_1b0,&local_1c0,&local_1e1);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->web_ladder_table_footer_filename,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1e1);
  local_1f8 = sv("EntriesPerPage",0xe);
  uVar4 = Jupiter::Config::get<unsigned_long>((Config *)&this->field_0x38,local_1f8,0x32);
  this->entries_per_page = uVar4;
  local_208 = sv("MinSearchNameLength",0x13);
  uVar4 = Jupiter::Config::get<unsigned_long>((Config *)&this->field_0x38,local_208,3);
  this->min_search_name_length = uVar4;
  local_228 = sv("EntryTableRow",0xd);
  local_238 = sv("<tr><td class=\"data-col-a\">{RANK}</td><td class=\"data-col-b\"><a href=\"profile?id={STEAM}&database={OBJECT}\">{NAME}</a></td><td class=\"data-col-a\">{SCORE}</td><td class=\"data-col-b\">{SPM}</td><td class=\"data-col-a\">{GAMES}</td><td class=\"data-col-b\">{WINS}</td><td class=\"data-col-a\">{LOSSES}</td><td class=\"data-col-b\">{WLR}</td><td class=\"data-col-a\">{KILLS}</td><td class=\"data-col-b\">{DEATHS}</td><td class=\"data-col-a\">{KDR}</td></tr>"
                 ,0x1b6);
  local_218 = (basic_string_view<char,_std::char_traits<char>_>)
              Jupiter::Config::get
                        (&this->field_0x38,local_228._M_len,local_228._M_str,local_238._M_len,
                         local_238._M_str);
  std::__cxx11::string::operator=((string *)&this->entry_table_row,&local_218);
  local_258 = sv("EntryProfilePrevious",0x14);
  local_268 = sv("<form class=\"profile-previous\"><input type=\"hidden\" name=\"database\" value=\"{OBJECT}\"/><input type=\"hidden\" name=\"id\" value=\"{WEAPON}\"/><input class=\"profile-previous-submit\" type=\"submit\" value=\"&#x21A9 Previous\" /></form>"
                 ,0xde);
  local_248 = (basic_string_view<char,_std::char_traits<char>_>)
              Jupiter::Config::get
                        (&this->field_0x38,local_258._M_len,local_258._M_str,local_268._M_len,
                         local_268._M_str);
  std::__cxx11::string::operator=((string *)&this->entry_profile_previous,&local_248);
  bVar6 = sv("EntryProfileNext",0x10);
  bVar7 = sv("<form class=\"profile-next\"><input type=\"hidden\" name=\"database\" value=\"{OBJECT}\"/><input type=\"hidden\" name=\"id\" value=\"{VSTEAM}\"/><input class=\"profile-next-submit\" type=\"submit\" value=\"Next &#x21AA\" /></form>"
             ,0xd2);
  local_288 = bVar6._M_len;
  local_280 = bVar6._M_str;
  local_298 = bVar7._M_len;
  local_290 = bVar7._M_str;
  local_278 = (basic_string_view<char,_std::char_traits<char>_>)
              Jupiter::Config::get(&this->field_0x38,local_288,local_280,local_298,local_290);
  std::__cxx11::string::operator=((string *)&this->entry_profile_next,&local_278);
  RenX::sanitizeTags((string *)&this->entry_table_row);
  RenX::sanitizeTags((string *)&this->entry_profile_previous);
  RenX::sanitizeTags((string *)&this->entry_profile_next);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            (&this->header);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            (&this->footer);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (&this->entry_profile,0,0xffffffffffffffff);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (&this->ladder_table_header,0,0xffffffffffffffff);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            (&this->ladder_table_footer,0,0xffffffffffffffff);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->web_header_filename);
  if (!bVar1) {
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&this->web_header_filename);
    pFStack_18 = fopen(pcVar5,"rb");
    if (pFStack_18 != (FILE *)0x0) {
      while( true ) {
        local_1c = fgetc(pFStack_18);
        if (local_1c == -1) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (&this->header,(char)local_1c);
      }
      fclose(pFStack_18);
    }
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->web_footer_filename);
  if (!bVar1) {
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&this->web_footer_filename);
    pFStack_18 = fopen(pcVar5,"rb");
    if (pFStack_18 != (FILE *)0x0) {
      while( true ) {
        local_1c = fgetc(pFStack_18);
        if (local_1c == -1) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (&this->footer,(char)local_1c);
      }
      fclose(pFStack_18);
    }
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->web_profile_filename);
  if (!bVar1) {
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&this->web_profile_filename);
    pFStack_18 = fopen(pcVar5,"rb");
    if (pFStack_18 != (FILE *)0x0) {
      while( true ) {
        local_1c = fgetc(pFStack_18);
        if (local_1c == -1) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (&this->entry_profile,(char)local_1c);
      }
      RenX::sanitizeTags((string *)&this->entry_profile);
      fclose(pFStack_18);
    }
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->web_ladder_table_header_filename);
  if (!bVar1) {
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&this->web_ladder_table_header_filename);
    pFStack_18 = fopen(pcVar5,"rb");
    if (pFStack_18 != (FILE *)0x0) {
      while( true ) {
        local_1c = fgetc(pFStack_18);
        if (local_1c == -1) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (&this->ladder_table_header,(char)local_1c);
      }
      fclose(pFStack_18);
    }
  }
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->web_ladder_table_footer_filename);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (&this->web_ladder_table_footer_filename);
    pFStack_18 = fopen(pcVar5,"rb");
    if (pFStack_18 != (FILE *)0x0) {
      while( true ) {
        local_1c = fgetc(pFStack_18);
        if (local_1c == -1) break;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  (&this->ladder_table_footer,(char)local_1c);
      }
      uVar3 = fclose(pFStack_18);
      pFStack_18 = (FILE *)(ulong)uVar3;
    }
    iVar2 = (int)pFStack_18;
  }
  return iVar2;
}

Assistant:

void RenX_Ladder_WebPlugin::init() {
	FILE *file;
	int chr;

	RenX_Ladder_WebPlugin::web_header_filename = static_cast<std::string>(this->config.get("HeaderFilename"sv, "RenX.Ladder.Web.Header.html"sv));
	RenX_Ladder_WebPlugin::web_footer_filename = static_cast<std::string>(this->config.get("FooterFilename"sv, "RenX.Ladder.Web.Footer.html"sv));
	RenX_Ladder_WebPlugin::web_profile_filename = static_cast<std::string>(this->config.get("ProfileFilename"sv, "RenX.Ladder.Web.Profile.html"sv));
	RenX_Ladder_WebPlugin::web_ladder_table_header_filename = static_cast<std::string>(this->config.get("LadderTableHeaderFilename"sv, "RenX.Ladder.Web.Ladder.Table.Header.html"sv));
	RenX_Ladder_WebPlugin::web_ladder_table_footer_filename = static_cast<std::string>(this->config.get("LadderTableFooterFilename"sv, "RenX.Ladder.Web.Ladder.Table.Footer.html"sv));
	RenX_Ladder_WebPlugin::entries_per_page = this->config.get<size_t>("EntriesPerPage"sv, 50);
	RenX_Ladder_WebPlugin::min_search_name_length = this->config.get<size_t>("MinSearchNameLength"sv, 3);

	RenX_Ladder_WebPlugin::entry_table_row = this->config.get("EntryTableRow"sv, R"html(<tr><td class="data-col-a">{RANK}</td><td class="data-col-b"><a href="profile?id={STEAM}&database={OBJECT}">{NAME}</a></td><td class="data-col-a">{SCORE}</td><td class="data-col-b">{SPM}</td><td class="data-col-a">{GAMES}</td><td class="data-col-b">{WINS}</td><td class="data-col-a">{LOSSES}</td><td class="data-col-b">{WLR}</td><td class="data-col-a">{KILLS}</td><td class="data-col-b">{DEATHS}</td><td class="data-col-a">{KDR}</td></tr>)html"sv);
	RenX_Ladder_WebPlugin::entry_profile_previous = this->config.get("EntryProfilePrevious"sv, R"html(<form class="profile-previous"><input type="hidden" name="database" value="{OBJECT}"/><input type="hidden" name="id" value="{WEAPON}"/><input class="profile-previous-submit" type="submit" value="&#x21A9 Previous" /></form>)html"sv);
	RenX_Ladder_WebPlugin::entry_profile_next = this->config.get("EntryProfileNext"sv, R"html(<form class="profile-next"><input type="hidden" name="database" value="{OBJECT}"/><input type="hidden" name="id" value="{VSTEAM}"/><input class="profile-next-submit" type="submit" value="Next &#x21AA" /></form>)html"sv);

	RenX::sanitizeTags(RenX_Ladder_WebPlugin::entry_table_row);
	RenX::sanitizeTags(RenX_Ladder_WebPlugin::entry_profile_previous);
	RenX::sanitizeTags(RenX_Ladder_WebPlugin::entry_profile_next);

	RenX_Ladder_WebPlugin::header.clear();
	RenX_Ladder_WebPlugin::footer.clear();
	RenX_Ladder_WebPlugin::entry_profile.erase();
	RenX_Ladder_WebPlugin::ladder_table_header.erase();
	RenX_Ladder_WebPlugin::ladder_table_footer.erase();

	/** Load header */
	if (!RenX_Ladder_WebPlugin::web_header_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_header_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::header += chr;
			fclose(file);
		}
	}

	/** Load footer */
	if (!RenX_Ladder_WebPlugin::web_footer_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_footer_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::footer += chr;
			fclose(file);
		}
	}

	/** Load profile */
	if (!RenX_Ladder_WebPlugin::web_profile_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_profile_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::entry_profile += chr;
			RenX::sanitizeTags(RenX_Ladder_WebPlugin::entry_profile);
			fclose(file);
		}
	}

	/** Load table header */
	if (!RenX_Ladder_WebPlugin::web_ladder_table_header_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_ladder_table_header_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::ladder_table_header += chr;
			fclose(file);
		}
	}

	/** Load table footer */
	if (!RenX_Ladder_WebPlugin::web_ladder_table_footer_filename.empty()) {
		file = fopen(RenX_Ladder_WebPlugin::web_ladder_table_footer_filename.c_str(), "rb");
		if (file != nullptr) {
			while ((chr = fgetc(file)) != EOF)
				RenX_Ladder_WebPlugin::ladder_table_footer += chr;
			fclose(file);
		}
	}
}